

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *right,size_t context)

{
  EditType EVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  ostream *poVar6;
  size_t sVar7;
  ulong uVar8;
  pointer pEVar9;
  ulong uVar10;
  ulong uVar11;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *plVar12;
  char edit;
  long lVar13;
  list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_> *plVar14;
  _List_node_base *p_Var15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  size_t i;
  size_t sVar20;
  long in_FS_OFFSET;
  Hunk hunk;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  stringstream ss;
  Hunk local_250;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_1e0;
  char local_1c1;
  stringstream local_1c0 [16];
  ostream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CalculateOptimalEdits(&local_1e0,left,right);
  std::__cxx11::stringstream::stringstream(local_1c0);
  uVar11 = 0;
  uVar17 = 0;
  lVar19 = 0;
  do {
    plVar14 = &local_250.hunk_;
    plVar12 = &local_250.hunk_adds_;
    uVar4 = (long)local_1e0.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_1e0.
                  super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2;
    if (uVar4 <= uVar17) break;
    uVar8 = (uVar11 + uVar4) - uVar17;
    lVar13 = (lVar19 + uVar4) - uVar17;
    uVar10 = uVar11;
    uVar16 = uVar17;
    lVar18 = lVar19;
    do {
      uVar11 = uVar10;
      uVar17 = uVar16;
      lVar19 = lVar18;
      if (local_1e0.
          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16] != kMatch) break;
      uVar10 = uVar10 + 1;
      lVar18 = lVar18 + 1;
      uVar16 = uVar16 + 1;
      uVar11 = uVar8;
      uVar17 = uVar4;
      lVar19 = lVar13;
    } while (uVar4 != uVar16);
    sVar20 = context;
    if (uVar11 < context) {
      sVar20 = uVar11;
    }
    local_250.left_start_ = (uVar11 - sVar20) + 1;
    local_250.right_start_ = (lVar19 - sVar20) + 1;
    local_250.common_ = 0;
    local_250.adds_ = 0;
    local_250.removes_ = 0;
    local_250.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_250.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_250.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_250.hunk_removes_;
    local_250.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node._M_size = 0;
    local_250.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar14;
    local_250.hunk_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar14;
    local_250.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar12;
    local_250.hunk_adds_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar12;
    local_250.hunk_removes_.
    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev =
         local_250.hunk_removes_.
         super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
         ._M_impl._M_node.super__List_node_base._M_next;
    if (sVar20 != 0) {
      lVar18 = uVar11 * 0x20 + sVar20 * -0x20;
      do {
        anon_unknown_1::Hunk::PushLine
                  (&local_250,' ',
                   *(char **)((long)&(((left->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar18));
        lVar18 = lVar18 + 0x20;
        sVar20 = sVar20 - 1;
      } while (sVar20 != 0);
    }
    if (uVar17 < (ulong)((long)local_1e0.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1e0.
                               super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 2)) {
      uVar4 = 0;
      do {
        if (context <= uVar4) {
          for (pEVar9 = local_1e0.
                        super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17;
              (pEVar9 != local_1e0.
                         super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                         ._M_impl.super__Vector_impl_data._M_finish && (*pEVar9 == kMatch));
              pEVar9 = pEVar9 + 1) {
          }
          if ((pEVar9 == local_1e0.
                         super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                         ._M_impl.super__Vector_impl_data._M_finish) ||
             (context <=
              ((long)pEVar9 -
               (long)local_1e0.
                     super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) - uVar17)) break;
        }
        EVar1 = local_1e0.
                super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17];
        uVar4 = uVar4 + 1;
        if (EVar1 != kMatch) {
          uVar4 = 0;
        }
        if ((EVar1 < 4) && (EVar1 != kAdd)) {
          edit = '-';
          if (EVar1 == kMatch) {
            edit = ' ';
          }
          anon_unknown_1::Hunk::PushLine
                    (&local_250,edit,
                     (left->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
        }
        if ((EVar1 & ~kRemove) == kAdd) {
          p_Var15 = (_List_node_base *)
                    (right->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar19]._M_dataplus._M_p;
          local_250.adds_ = local_250.adds_ + 1;
          p_Var5 = (_List_node_base *)operator_new(0x20);
          *(undefined1 *)&p_Var5[1]._M_next = 0x2b;
          p_Var5[1]._M_prev = p_Var15;
          std::__detail::_List_node_base::_M_hook(p_Var5);
          local_250.hunk_adds_.
          super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
          ._M_impl._M_node._M_size =
               local_250.hunk_adds_.
               super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
               ._M_impl._M_node._M_size + 1;
        }
        uVar11 = uVar11 + (EVar1 != kAdd);
        lVar19 = lVar19 + (ulong)(EVar1 != kRemove);
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)local_1e0.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_1e0.
                                      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2));
    }
    bVar2 = local_250.removes_ != 0;
    bVar3 = local_250.adds_ != 0;
    if (bVar2 || bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0,"@@ ",3);
      if (local_250.removes_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1b0,"-",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      }
      if ((local_250.removes_ != 0) && (local_250.adds_ != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1b0," ",1);
      }
      if (local_250.adds_ != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1b0,"+",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0," @@\n",4);
      anon_unknown_1::Hunk::FlushEdits(&local_250);
      for (p_Var15 = local_250.hunk_.
                     super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
          p_Var15 != (_List_node_base *)&local_250.hunk_; p_Var15 = p_Var15->_M_next) {
        local_1c1 = *(char *)&p_Var15[1]._M_next;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(local_1b0,&local_1c1,1);
        p_Var5 = p_Var15[1]._M_prev;
        if (p_Var5 == (_List_node_base *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar7 = strlen((char *)p_Var5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)p_Var5,sVar7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      }
    }
    p_Var15 = local_250.hunk_removes_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var15 != (_List_node_base *)&local_250.hunk_removes_) {
      p_Var5 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var15,0x20);
      p_Var15 = p_Var5;
    }
    p_Var15 = local_250.hunk_adds_.
              super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var5 = local_250.hunk_.
                    super__List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next,
          p_Var15 != (_List_node_base *)&local_250.hunk_adds_) {
      p_Var5 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                  *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var15,0x20);
      p_Var15 = p_Var5;
    }
    while (p_Var5 != (_List_node_base *)&local_250.hunk_) {
      p_Var15 = (((_List_base<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var5,0x20);
      p_Var5 = p_Var15;
    }
  } while (bVar2 || bVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::ios_base::~ios_base(local_140);
  if (local_1e0.
      super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.
                    super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.
                          super__Vector_base<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        std::vector<EditType>::const_iterator it = edits.begin() + edit_i;
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() || (it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}